

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_36::HttpClientAdapter::connect
          (HttpClientAdapter *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long *plVar1;
  SourceLocation location;
  SourceLocation location_00;
  Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,_std::nullptr_t> *params;
  Own<kj::AsyncIoStream,_std::nullptr_t> *pOVar2;
  RefOrVoid<kj::HttpHeaders> pHVar3;
  RefOrVoid<kj::AsyncIoStream> pAVar4;
  RefOrVoid<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl> pCVar5;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t> *other;
  String *pSVar6;
  Own<kj::HttpHeaders,_std::nullptr_t> *other_00;
  Promise<kj::HttpClient::ConnectRequest::Status> *pPVar7;
  undefined4 in_register_0000000c;
  char *pcVar8;
  void *__child_stack;
  undefined4 in_register_00000034;
  __fn *in_R8;
  __fn *__arg;
  HttpConnectSettings *in_R9;
  undefined8 in_stack_fffffffffffffda0;
  SourceLocation local_1d8;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t> local_1c0;
  String local_1b0;
  Own<kj::HttpHeaders,_std::nullptr_t> local_198;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_188;
  HttpConnectSettings local_178;
  StringPtr local_168;
  undefined1 local_158 [16];
  Promise<void> promise;
  Own<kj::AsyncIoStream,_std::nullptr_t> connectStream;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t> response;
  undefined1 local_120 [24];
  undefined1 local_108 [8];
  PromiseFulfillerPair<kj::HttpClient::ConnectRequest::Status> paf;
  TwoWayPipe pipe;
  HttpHeaders local_c0;
  undefined1 local_60 [8];
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  String hostCopy;
  HttpConnectSettings *settings_local;
  HttpHeaders *headers_local;
  HttpClientAdapter *this_local;
  StringPtr host_local;
  
  pcVar8 = (char *)CONCAT44(in_register_0000000c,__len);
  __arg = in_R8;
  this_local = (HttpClientAdapter *)__addr;
  host_local.content.ptr = pcVar8;
  host_local.content.size_ = (size_t)this;
  str<kj::StringPtr&>((String *)&headersCopy.ptr,(kj *)&this_local,(StringPtr *)__addr);
  HttpHeaders::clone(&local_c0,in_R8,__child_stack,(int)pcVar8,__arg);
  heap<kj::HttpHeaders>((kj *)local_60,&local_c0);
  HttpHeaders::~HttpHeaders(&local_c0);
  newTwoWayPipe();
  SourceLocation::SourceLocation
            ((SourceLocation *)local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"connect",0x1a71,0x10);
  location_00.function = (char *)local_120._16_8_;
  location_00.fileName = (char *)local_120._8_8_;
  location_00.lineNumber = (int)in_stack_fffffffffffffda0;
  location_00.columnNumber = (int)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  newPromiseAndFulfiller<kj::HttpClient::ConnectRequest::Status>(location_00);
  params = mv<kj::Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,decltype(nullptr)>>
                     ((Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,_std::nullptr_t>
                       *)&paf);
  pOVar2 = mv<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&paf.fulfiller.ptr);
  refcounted<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,kj::Own<kj::PromiseFulfiller<kj::HttpClient::ConnectRequest::Status>,decltype(nullptr)>,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
            ((kj *)&connectStream.ptr,params,pOVar2);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>::operator->
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>
              *)&connectStream.ptr);
  ConnectResponseImpl::getConnectStream((ConnectResponseImpl *)&promise);
  plVar1 = *(long **)(CONCAT44(in_register_00000034,__fd) + 8);
  StringPtr::StringPtr(&local_168,(String *)&headersCopy.ptr);
  pHVar3 = Own<kj::HttpHeaders,_std::nullptr_t>::operator*
                     ((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60);
  pAVar4 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator*
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&promise);
  pCVar5 = Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>::
           operator*((Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>
                      *)&connectStream.ptr);
  HttpConnectSettings::HttpConnectSettings(&local_178,in_R9);
  (**(code **)(*plVar1 + 8))
            (local_158,plVar1,local_168.content.ptr,local_168.content.size_,pHVar3,pAVar4,pCVar5,
             &local_178);
  other = mv<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,decltype(nullptr)>>
                    ((Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>
                      *)&connectStream.ptr);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>::Own
            (&local_1c0,other);
  pSVar6 = mv<kj::String>((String *)&headersCopy.ptr);
  String::String(&local_1b0,pSVar6);
  other_00 = mv<kj::Own<kj::HttpHeaders,decltype(nullptr)>>
                       ((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60);
  Own<kj::HttpHeaders,_std::nullptr_t>::Own(&local_198,other_00);
  pOVar2 = mv<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                     ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&promise);
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own(&local_188,pOVar2);
  SourceLocation::SourceLocation
            (&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,"connect",0x1a7b,0x14);
  location.function = local_1d8.function;
  location.fileName = local_1d8.fileName;
  location.lineNumber = local_1d8.lineNumber;
  location.columnNumber = local_1d8.columnNumber;
  Promise<void>::
  eagerlyEvaluate<kj::(anonymous_namespace)::HttpClientAdapter::connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::_lambda(kj::Exception&&)_1_>
            ((Promise<void> *)(local_158 + 8),(Type *)local_158,location);
  kj::(anonymous_namespace)::HttpClientAdapter::
  connect(kj::StringPtr,kj::HttpHeaders_const&,kj::HttpConnectSettings)::{lambda(kj::Exception&&)#1}
  ::~Exception((_lambda_kj__Exception____1_ *)&local_1c0);
  Promise<void>::~Promise((Promise<void> *)local_158);
  pPVar7 = mv<kj::Promise<kj::HttpClient::ConnectRequest::Status>>
                     ((Promise<kj::HttpClient::ConnectRequest::Status> *)local_108);
  Promise<kj::HttpClient::ConnectRequest::Status>::Promise
            ((Promise<kj::HttpClient::ConnectRequest::Status> *)this,pPVar7);
  mv<kj::Promise<void>>((Promise<void> *)(local_158 + 8));
  Own<kj::AsyncIoStream,decltype(nullptr)>::attach<kj::Promise<void>>
            ((Own<kj::AsyncIoStream,decltype(nullptr)> *)&this->service,
             (Promise<void> *)&pipe.ends[0].ptr);
  Promise<void>::~Promise((Promise<void> *)(local_158 + 8));
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own((Own<kj::AsyncIoStream,_std::nullptr_t> *)&promise);
  Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::HttpClientAdapter::ConnectResponseImpl,_std::nullptr_t>
              *)&connectStream.ptr);
  PromiseFulfillerPair<kj::HttpClient::ConnectRequest::Status>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<kj::HttpClient::ConnectRequest::Status> *)local_108);
  TwoWayPipe::~TwoWayPipe((TwoWayPipe *)&paf.fulfiller.ptr);
  Own<kj::HttpHeaders,_std::nullptr_t>::~Own((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60);
  String::~String((String *)&headersCopy.ptr);
  return (int)this;
}

Assistant:

ConnectRequest connect(
      kj::StringPtr host, const HttpHeaders& headers, HttpConnectSettings settings) override {
    // We have to clone the host and the headers because HttpServer implementation are allowed to
    // assusme that they remain valid until the service handler completes whereas HttpClient callers
    // are allowed to destroy them immediately after the call.
    auto hostCopy = kj::str(host);
    auto headersCopy = kj::heap(headers.clone());

    // 1. Create a new TwoWayPipe, one will be returned with the ConnectRequest,
    //    the other will be held by the ConnectResponseImpl.
    auto pipe = kj::newTwoWayPipe();

    // 2. Create a promise/fulfiller pair for the status. The promise will be
    //    returned with the ConnectResponse, the fulfiller will be held by the
    //    ConnectResponseImpl.
    auto paf = kj::newPromiseAndFulfiller<ConnectRequest::Status>();

    // 3. Create the ConnectResponseImpl
    auto response = kj::refcounted<ConnectResponseImpl>(kj::mv(paf.fulfiller),
                                                        kj::mv(pipe.ends[0]));

    // 5. Call service.connect, passing in the tunnel.
    //    The call to tunnel->getConnectStream() returns a guarded stream that will buffer
    //    writes until the status is indicated by calling accept/reject.
    auto connectStream = response->getConnectStream();
    auto promise = service.connect(hostCopy, *headersCopy, *connectStream, *response, settings)
        .eagerlyEvaluate([response=kj::mv(response),
                          host=kj::mv(hostCopy),
                          headers=kj::mv(headersCopy),
                          connectStream=kj::mv(connectStream)](kj::Exception&& ex) mutable {
      // A few things need to happen here.
      //   1. We'll log the exception.
      //   2. We'll break the pipe.
      //   3. We'll reject the status promise if it is still pending.
      //
      // We'll do all of this within the ConnectResponseImpl, however, since it
      // maintains the state necessary here.
      response->handleException(kj::mv(ex), kj::mv(connectStream));
    });

    // TODO(bug): There's a challenge with attaching the service.connect promise to the
    // connection stream below in that the client will likely drop the connection as soon
    // as it reads EOF, but the promise representing the service connect() call may still
    // be running and want to do some cleanup after it has sent EOF. That cleanup will be
    // canceled. For regular HTTP calls, DelayedEofInputStream was created to address this
    // exact issue but with connect() being bidirectional it's rather more difficult. We
    // want a delay similar to what DelayedEofInputStream adds but only when both directions
    // have been closed. That currently is not possible until we have an alternative to
    // shutdownWrite() that returns a Promise (e.g. Promise<void> end()). For now, we can
    // live with the current limitation.
    return ConnectRequest {
      kj::mv(paf.promise),
      pipe.ends[1].attach(kj::mv(promise)),
    };
  }